

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_21360af::EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test::TestBody
          (EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test *this)

{
  uint8_t *puVar1;
  uint uVar2;
  int16_t *scan;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  aom_usec_timer timer_ref;
  aom_usec_timer timer;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  puts("Note: Only test the largest possible eob case!");
  puVar1 = (this->super_EncodeTxbTest).levels_buf_;
  lVar9 = 0;
  do {
    uVar5 = (uint)lVar9 & 0xff;
    if (uVar5 < 0x11) {
      lVar6 = 3;
      if ((1 < uVar5 - 0xb) && (uVar5 != 4)) {
LAB_00747ddc:
        lVar6 = lVar9;
      }
    }
    else if (uVar5 == 0x11) {
      lVar6 = 9;
    }
    else {
      if (uVar5 != 0x12) goto LAB_00747ddc;
      lVar6 = 10;
    }
    uVar5 = (uint)lVar9 & 0xff;
    if (uVar5 < 0x11) {
      lVar7 = 3;
      if ((1 < uVar5 - 0xb) && (uVar5 != 4)) {
LAB_00747e1a:
        lVar7 = lVar9;
      }
    }
    else if (uVar5 == 0x11) {
      lVar7 = 9;
    }
    else {
      if (uVar5 != 0x12) goto LAB_00747e1a;
      lVar7 = 10;
    }
    iVar4 = tx_size_high_log2[lVar6];
    if (uVar5 < 0x11) {
      lVar6 = 3;
      if ((1 < uVar5 - 0xb) && (uVar5 != 4)) {
LAB_00747e62:
        lVar6 = lVar9;
      }
    }
    else if (uVar5 == 0x11) {
      lVar6 = 9;
    }
    else {
      if (uVar5 != 0x12) goto LAB_00747e62;
      lVar6 = 10;
    }
    uVar5 = ::tx_size_wide[lVar9];
    uVar2 = ::tx_size_high[lVar9];
    scan = av1_scan_orders[lVar9][0].scan;
    iVar8 = ::tx_size_wide[lVar7] * ::tx_size_high[lVar6];
    uVar3 = 2000000000 / (long)iVar8;
    uVar10 = uVar3 & 0xffffffff;
    (this->super_EncodeTxbTest).levels_ = puVar1;
    EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar4,iVar8);
    gettimeofday(&local_70,(__timezone_ptr_t)0x0);
    if ((int)uVar3 < 1) {
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      (this->super_EncodeTxbTest).levels_ = puVar1;
      EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar4,iVar8);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
    }
    else {
      uVar12 = uVar3 & 0xffffffff;
      do {
        av1_get_nz_map_contexts_c
                  ((this->super_EncodeTxbTest).levels_,scan,(uint16_t)iVar8,(TX_SIZE)lVar9,'\0',
                   (this->super_EncodeTxbTest).coeff_contexts_ref_);
        uVar11 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar11;
      } while (uVar11 != 0);
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      (this->super_EncodeTxbTest).levels_ = puVar1;
      EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar4,iVar8);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      if (0 < (int)uVar3) {
        do {
          (*(this->super_EncodeTxbTest).get_nz_map_contexts_func_)
                    ((this->super_EncodeTxbTest).levels_,scan,(uint16_t)iVar8,(TX_SIZE)lVar9,'\0',
                     (this->super_EncodeTxbTest).coeff_contexts_);
          uVar11 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar11;
        } while (uVar11 != 0);
      }
    }
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    lVar6 = local_60.tv_usec - local_70.tv_usec;
    iVar4 = (int)lVar6 + 1000000;
    if (-1 < lVar6) {
      iVar4 = (int)lVar6;
    }
    lVar7 = local_40.tv_usec - local_50.tv_usec;
    iVar8 = (int)lVar7 + 1000000;
    if (-1 < lVar7) {
      iVar8 = (int)lVar7;
    }
    dVar13 = (double)(iVar8 + ((int)(lVar7 >> 0x3f) + ((int)local_40.tv_sec - (int)local_50.tv_sec))
                              * 1000000);
    dVar14 = (double)(iVar4 + ((int)(lVar6 >> 0x3f) + ((int)local_60.tv_sec - (int)local_70.tv_sec))
                              * 1000000);
    printf("get_nz_map_contexts_%2dx%2d: %7.1f ms ref %7.1f ms gain %4.2f\n",dVar13 / 1000.0,
           dVar14 / 1000.0,dVar14 / dVar13,(ulong)uVar5,(ulong)uVar2);
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x13) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(EncodeTxbTest, DISABLED_SpeedTestGetNzMapContexts) {
  SpeedTestGetNzMapContextsRun();
}